

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O3

Range __thiscall bssl::DTLSMessageBitmap::NextUnmarkedRange(DTLSMessageBitmap *this,size_t start)

{
  uint8_t *puVar1;
  ulong uVar2;
  uchar *puVar3;
  byte b;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  Range RVar9;
  
  uVar5 = this->first_unmarked_byte_ << 3;
  if (uVar5 <= start) {
    uVar5 = start;
  }
  uVar2 = (this->bytes_).size_;
  uVar6 = uVar5 >> 3;
  if (uVar6 < uVar2) {
    puVar3 = (this->bytes_).data_;
    b = ~(-1 << ((byte)uVar5 & 7)) | puVar3[uVar6];
    if (b == 0xff) {
      do {
        if (uVar2 - 1 == uVar6) goto LAB_0016e4f3;
        b = puVar3[uVar6 + 1];
        uVar6 = uVar6 + 1;
      } while (b == 0xff);
    }
    RVar9 = FirstUnmarkedRangeInByte(b);
    sVar7 = RVar9.end;
    if (RVar9.start == sVar7) {
      __assert_fail("!range.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0x93,
                    "DTLSMessageBitmap::Range bssl::DTLSMessageBitmap::NextUnmarkedRange(size_t) const"
                   );
    }
    sVar8 = RVar9.start + uVar6 * 8;
    if (sVar7 == 8) {
      uVar5 = uVar6 + 1;
      uVar4 = uVar5;
      if (uVar5 < uVar2) {
        uVar4 = uVar2;
      }
      sVar7 = uVar6 << 3;
      do {
        if (uVar2 <= uVar5) {
          sVar7 = uVar4 << 3;
          goto LAB_0016e504;
        }
        puVar1 = puVar3 + uVar5;
        sVar7 = sVar7 + 8;
        uVar5 = uVar5 + 1;
      } while (*puVar1 == '\0');
      RVar9 = FirstUnmarkedRangeInByte(*puVar1);
      if (RVar9.start == 0) {
        sVar7 = sVar7 + RVar9.end;
      }
    }
    else {
      sVar7 = sVar7 + uVar6 * 8;
    }
  }
  else {
LAB_0016e4f3:
    sVar8 = 0;
    sVar7 = 0;
  }
LAB_0016e504:
  RVar9.end = sVar7;
  RVar9.start = sVar8;
  return RVar9;
}

Assistant:

DTLSMessageBitmap::Range DTLSMessageBitmap::NextUnmarkedRange(
    size_t start) const {
  // Don't bother looking at bytes that are known to be fully marked.
  start = std::max(start, first_unmarked_byte_ << 3);

  size_t idx = start >> 3;
  if (idx >= bytes_.size()) {
    return Range{0, 0};
  }

  // Look at the bits from |start| up to a byte boundary.
  uint8_t byte = bytes_[idx] | BitRange(0, start & 7);
  if (byte == 0xff) {
    // Nothing unmarked at this byte. Keep searching for an unmarked bit.
    for (idx = idx + 1; idx < bytes_.size(); idx++) {
      if (bytes_[idx] != 0xff) {
        byte = bytes_[idx];
        break;
      }
    }
    if (idx >= bytes_.size()) {
      return Range{0, 0};
    }
  }

  Range range = FirstUnmarkedRangeInByte(byte);
  assert(!range.empty());
  bool should_extend = range.end == 8;
  range.start += idx << 3;
  range.end += idx << 3;
  if (!should_extend) {
    // The range did not end at a byte boundary. We're done.
    return range;
  }

  // Collect all fully unmarked bytes.
  for (idx = idx + 1; idx < bytes_.size(); idx++) {
    if (bytes_[idx] != 0) {
      break;
    }
  }
  range.end = idx << 3;

  // Add any bits from the remaining byte, if any.
  if (idx < bytes_.size()) {
    Range extra = FirstUnmarkedRangeInByte(bytes_[idx]);
    if (extra.start == 0) {
      range.end += extra.end;
    }
  }

  return range;
}